

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void assert_hex_decode(string *input,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  string actual;
  string sStack_38;
  
  QUtil::hex_decode(&sStack_38,input);
  bVar1 = std::operator!=(expected,&sStack_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"hex encode ");
    poVar2 = std::operator<<(poVar2,(string *)input);
    poVar2 = std::operator<<(poVar2,": expected = ");
    poVar2 = std::operator<<(poVar2,(string *)expected);
    poVar2 = std::operator<<(poVar2,"; actual = ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void
assert_hex_decode(std::string const& input, std::string const& expected)
{
    std::string actual = QUtil::hex_decode(input);
    if (expected != actual) {
        std::cout << "hex encode " << input << ": expected = " << expected
                  << "; actual = " << actual << std::endl;
    }
}